

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int parse_path_key_expr(char *id,char **prefix,int *pref_len,char **name,int *nam_len,
                       int *parent_times)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  bool bVar5;
  int local_4c;
  int par_times;
  int ret;
  int parsed;
  int *parent_times_local;
  int *nam_len_local;
  char **name_local;
  int *pref_len_local;
  char **prefix_local;
  char *id_local;
  
  par_times = 0;
  local_4c = 0;
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x17c,
                  "int parse_path_key_expr(const char *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (parent_times == (int *)0x0) {
    __assert_fail("parent_times",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x17d,
                  "int parse_path_key_expr(const char *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (prefix != (char **)0x0) {
    *prefix = (char *)0x0;
  }
  if (pref_len != (int *)0x0) {
    *pref_len = 0;
  }
  if (name != (char **)0x0) {
    *name = (char *)0x0;
  }
  if (nam_len != (int *)0x0) {
    *nam_len = 0;
  }
  prefix_local = (char **)id;
  if (*parent_times == 0) {
    iVar2 = strncmp(id,"current()",9);
    if (iVar2 != 0) {
      return 0;
    }
    par_times = 9;
    prefix_local = (char **)(id + 9);
    while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*(char *)prefix_local] & 0x2000) != 0) {
      par_times = par_times + 1;
      prefix_local = (char **)((long)prefix_local + 1);
    }
    if (*(char *)prefix_local != '/') {
      return -par_times;
    }
    do {
      ppcVar1 = prefix_local;
      iVar2 = par_times;
      prefix_local = (char **)((long)ppcVar1 + 1);
      par_times = iVar2 + 1;
      ppuVar4 = __ctype_b_loc();
    } while (((*ppuVar4)[(int)*(char *)prefix_local] & 0x2000) != 0);
    iVar3 = strncmp((char *)prefix_local,"..",2);
    if (iVar3 != 0) {
      return -par_times;
    }
    local_4c = 1;
    par_times = iVar2 + 3;
    prefix_local = (char **)((long)ppcVar1 + 3);
    while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*(char *)prefix_local] & 0x2000) != 0) {
      par_times = par_times + 1;
      prefix_local = (char **)((long)prefix_local + 1);
    }
  }
  if (*(char *)prefix_local == '/') {
    do {
      prefix_local = (char **)((long)prefix_local + 1);
      par_times = par_times + 1;
      ppuVar4 = __ctype_b_loc();
    } while (((*ppuVar4)[(int)*(char *)prefix_local] & 0x2000) != 0);
    while( true ) {
      iVar2 = strncmp((char *)prefix_local,"..",2);
      bVar5 = false;
      if (iVar2 == 0) {
        bVar5 = *parent_times == 0;
      }
      if (!bVar5) {
        if (*parent_times == 0) {
          *parent_times = local_4c;
        }
        iVar2 = parse_node_identifier((char *)prefix_local,prefix,pref_len,name,nam_len);
        if (0 < iVar2) {
          return iVar2 + par_times;
        }
        return iVar2 - par_times;
      }
      local_4c = local_4c + 1;
      par_times = par_times + 2;
      prefix_local = (char **)((long)prefix_local + 2);
      while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*(char *)prefix_local] & 0x2000) != 0) {
        par_times = par_times + 1;
        prefix_local = (char **)((long)prefix_local + 1);
      }
      if (*(char *)prefix_local != '/') break;
      do {
        prefix_local = (char **)((long)prefix_local + 1);
        par_times = par_times + 1;
        ppuVar4 = __ctype_b_loc();
      } while (((*ppuVar4)[(int)*(char *)prefix_local] & 0x2000) != 0);
    }
  }
  id_local._4_4_ = -par_times;
  return id_local._4_4_;
}

Assistant:

static int
parse_path_key_expr(const char *id, const char **prefix, int *pref_len, const char **name, int *nam_len,
                    int *parent_times)
{
    int parsed = 0, ret, par_times = 0;

    assert(id);
    assert(parent_times);
    if (prefix) {
        *prefix = NULL;
    }
    if (pref_len) {
        *pref_len = 0;
    }
    if (name) {
        *name = NULL;
    }
    if (nam_len) {
        *nam_len = 0;
    }

    if (!*parent_times) {
        /* current-function-invocation *WSP "/" *WSP rel-path-keyexpr */
        if (strncmp(id, "current()", 9)) {
            return -parsed;
        }

        parsed += 9;
        id += 9;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        if (id[0] != '/') {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        /* rel-path-keyexpr */
        if (strncmp(id, "..", 2)) {
            return -parsed;
        }
        ++par_times;

        parsed += 2;
        id += 2;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    /* 1*(".." *WSP "/" *WSP) *(node-identifier *WSP "/" *WSP) node-identifier
     *
     * first parent reference with whitespaces already parsed
     */
    if (id[0] != '/') {
        return -parsed;
    }

    ++parsed;
    ++id;

    while (isspace(id[0])) {
        ++parsed;
        ++id;
    }

    while (!strncmp(id, "..", 2) && !*parent_times) {
        ++par_times;

        parsed += 2;
        id += 2;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        if (id[0] != '/') {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    if (!*parent_times) {
        *parent_times = par_times;
    }

    /* all parent references must be parsed at this point */
    if ((ret = parse_node_identifier(id, prefix, pref_len, name, nam_len)) < 1) {
        return -parsed+ret;
    }

    parsed += ret;
    id += ret;

    return parsed;
}